

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer pGVar3;
  pointer pGVar4;
  size_type sVar5;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_e8;
  Enum local_e0;
  Enum local_dc;
  undefined1 local_d8 [8];
  __single_object field_1;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> local_a8;
  __single_object field;
  undefined1 local_98 [8];
  __single_object import;
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    RVar2 = Expect(this,Global);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)&export_fields.size_);
      ParseBindVarOpt(this,(string *)&export_fields.size_);
      intrusive_list<wabt::ModuleField>::intrusive_list
                ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
      import._M_t.
      super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
      super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._4_4_ =
           ParseInlineExports(this,(ModuleFieldList *)&stack0xffffffffffffff78,Global);
      bVar1 = Failed(import._M_t.
                     super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
                     .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
        super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar1 = PeekMatchLpar(this,Import);
        if (bVar1) {
          CheckImportOrdering(this,module);
          std::make_unique<wabt::GlobalImport,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
          pGVar3 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::
                   get((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                       local_98);
          field._M_t.
          super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
               ParseInlineImport(this,(Import *)pGVar3);
          bVar1 = Failed(field._M_t.
                         super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_
                        );
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
            super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            pGVar3 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::
                     operator->((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>
                                 *)local_98);
            field._M_t.
            super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._0_4_ =
                 ParseGlobalType(this,&pGVar3->global);
            bVar1 = Failed(field._M_t.
                           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl.
                           _0_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
              .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              GetLocation((Location *)&stack0xffffffffffffff38,this);
              std::
              make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
                        (&local_a8,(Location *)local_98);
              std::
              unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
              unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                          *)&field_1,
                         (unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                          *)&local_a8);
              Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                          *)&field_1);
              std::
              unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
              ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           *)&field_1);
              std::
              unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
              ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           *)&local_a8);
              import._M_t.
              super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
              .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 0;
            }
          }
          std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::~unique_ptr
                    ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                     local_98);
        }
        else {
          std::make_unique<wabt::GlobalModuleField,wabt::Location&,std::__cxx11::string&>
                    ((Location *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
          pGVar4 = std::
                   unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                   ::operator->((unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                 *)local_d8);
          local_dc = (Enum)ParseGlobalType(this,&pGVar4->global);
          bVar1 = Failed((Result)local_dc);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
            super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            pGVar4 = std::
                     unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                     ::operator->((unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                   *)local_d8);
            local_e0 = (Enum)ParseTerminatingInstrList(this,&(pGVar4->global).init_expr);
            bVar1 = Failed((Result)local_e0);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
              .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              std::
              unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
              unique_ptr(&local_e8,
                         (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                          *)local_d8);
              Module::AppendField(module,&local_e8);
              std::
              unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
              ~unique_ptr(&local_e8);
              import._M_t.
              super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
              .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 0;
            }
          }
          std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)local_d8);
        }
        if ((int)import._M_t.
                 super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
                 .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl == 0) {
          sVar5 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size
                            (&module->globals);
          anon_unknown_1::AppendInlineExportFields
                    (module,(ModuleFieldList *)&stack0xffffffffffffff78,(int)sVar5 - 1);
          RVar2 = Expect(this,Rpar);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
            super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            Result::Result((Result *)((long)&this_local + 4),Ok);
            import._M_t.
            super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
            super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._0_4_ = 1;
          }
        }
      }
      intrusive_list<wabt::ModuleField>::~intrusive_list
                ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
      std::__cxx11::string::~string((string *)&export_fields.size_);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}